

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O3

int do_ret(void)

{
  uint uVar1;
  vm_register *pvVar2;
  undefined4 *puVar3;
  uint uVar4;
  ulong uVar5;
  
  pvVar2 = registe_ptr;
  if (code_ptr[registe_ptr->IP + 1] == '\x06') {
    uVar5 = (ulong)registe_ptr->SP - (ulong)*(uint *)(code_ptr + (ulong)registe_ptr->IP + 2);
    uVar4 = registe_ptr->SP - *(uint *)(code_ptr + (ulong)registe_ptr->IP + 2);
  }
  else {
    if (code_ptr[registe_ptr->IP + 1] != '\x05') {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xf6;
      __cxa_throw(puVar3,&int::typeinfo,0);
    }
    uVar4 = registe_ptr->SP;
    uVar5 = (ulong)uVar4;
  }
  uVar1 = *(uint *)(stack_ptr + uVar5);
  registe_ptr->SP = uVar4 - 4;
  pvVar2->IP = uVar1;
  return 1;
}

Assistant:

int do_ret() {
	if (code_ptr[registe_ptr->IP + 1] == 5) {//寄存器读数
		uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
		unsigned num = *register_list[high];
		unsigned ret = *(unsigned*)(stack_ptr+registe_ptr->SP);
		registe_ptr->SP = registe_ptr->SP-4;
		registe_ptr->IP = ret; // 修改
	}
	else if (code_ptr[registe_ptr->IP + 1] == 6) {//立即数读数
		unsigned num = *(unsigned*)(code_ptr + registe_ptr->IP + 2);
		unsigned ret = *(unsigned*)(stack_ptr+registe_ptr->SP-num);
		registe_ptr->SP = registe_ptr->SP- (num+4);
		registe_ptr->IP = ret ;//修改
	}
	else throw(LVM_EXECUTE_ERROR);

	return LVM_SUCCESS;
}